

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O0

TempFile * __thiscall
TempFile::Create(TempFile *__return_storage_ptr__,TempFile *this,string_view base_template)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  char *pcVar4;
  const_iterator pvVar5;
  const_iterator pvVar6;
  pointer pcVar7;
  FILE *f;
  ulong uVar8;
  allocator local_b1;
  string local_b0 [32];
  string_view local_90;
  int local_80;
  int fd;
  char *local_70;
  char *it;
  unique_ptr<char[],_std::default_delete<char[]>_> path_template;
  size_t len;
  string_view tmpdir;
  char *raw_tmpdir;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined1 local_20 [8];
  string_view base_template_local;
  
  base_template_local._M_len = base_template._M_len;
  local_20 = (undefined1  [8])this;
  base_template_local._M_str = (char *)__return_storage_ptr__;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,sVar2 - 6,
                        0xffffffffffffffff);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&raw_tmpdir,"XXXXXX");
  bVar1 = std::operator==(local_30,_raw_tmpdir);
  if (!bVar1) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc"
            ,0x96,"base_template.substr(base_template.size() - 6)","==","\"XXXXXX\"");
    abort();
  }
  tmpdir._M_str = getenv("TMPDIR");
  if (tmpdir._M_str == (char *)0x0) {
    tmpdir._M_str = "/tmp";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&len,tmpdir._M_str);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&len);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  path_template._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)(sVar2 + 2 + sVar3)
  ;
  pcVar4 = (char *)operator_new__((ulong)path_template._M_t.
                                         super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                         .super__Head_base<0UL,_char_*,_false>._M_head_impl);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&it,pcVar4);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&len);
  pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&len);
  pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&it);
  pcVar4 = std::copy<char_const*,char*>(pvVar5,pvVar6,pcVar7);
  local_70 = pcVar4 + 1;
  *pcVar4 = '/';
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pcVar4 = std::copy<char_const*,char*>(pvVar5,pvVar6,local_70);
  *pcVar4 = '\0';
  local_70 = pcVar4 + 1;
  pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&it);
  if (pcVar4 + 1 !=
      pcVar7 + (long)path_template._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                     _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc"
            ,0xa3,"it","==","path_template.get() + len");
    abort();
  }
  pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&it);
  local_80 = mkstemp(pcVar7);
  if (local_80 < 0) {
    perror("mkstemp");
  }
  if (local_80 < 0) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc"
            ,0xa9,"fd",">=","0");
    abort();
  }
  f = fdopen(local_80,"r+");
  pcVar7 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&it);
  uVar8 = (long)path_template._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl - 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,pcVar7,uVar8,&local_b1);
  local_90 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_b0);
  TempFile(__return_storage_ptr__,(FILE *)f,local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

static TempFile Create(std::string_view base_template) {
    CHECK_EQ(base_template.substr(base_template.size() - 6), "XXXXXX");

    const char* raw_tmpdir = getenv("TMPDIR");
    if (raw_tmpdir == nullptr) {
      raw_tmpdir = "/tmp";
    }
    std::string_view tmpdir{raw_tmpdir};
    size_t len = tmpdir.size() + 1 + base_template.size() + 1;
    std::unique_ptr<char[]> path_template{new char[len]};
    auto it = std::copy(tmpdir.begin(), tmpdir.end(), path_template.get());
    *it++ = '/';
    it = std::copy(base_template.begin(), base_template.end(), it);
    *it++ = '\0';
    CHECK_EQ(it, path_template.get() + len);

    int fd = mkstemp(path_template.get());
    if (fd < 0) {
      perror("mkstemp");
    }
    CHECK_GE(fd, 0);

    return TempFile{fdopen(fd, "r+"), std::string(path_template.get(), len-1)};
  }